

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

Mio_Gate_t **
Mio_CollectRoots(Mio_Library_t *pLib,int nInputs,float tDelay,int fSkipInv,int *pnGates,int fVerbose
                )

{
  word wVar1;
  Mio_Gate_t *pGate;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Mio_Gate_t **ppG1;
  Mio_Gate_t *pGate_00;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  
  iVar5 = Mio_LibraryReadGateNum(pLib);
  ppG1 = (Mio_Gate_t **)malloc((long)iVar5 << 3);
  iVar6 = Mio_LibraryHasProfile(pLib);
  if (iVar6 != 0) {
    puts("Mio_CollectRoots(): Using gate profile to select gates for mapping.");
  }
  pGate_00 = Mio_LibraryReadGates(pLib);
  uVar2 = 0;
  do {
    if (pGate_00 == (Mio_Gate_t *)0x0) {
      if (0 < (int)uVar2) {
        qsort(ppG1,(ulong)uVar2,8,Mio_DelayCompare);
        iVar5 = Mio_DelayCompare(ppG1,ppG1 + ((ulong)uVar2 - 1));
        if (0 < iVar5) {
          __assert_fail("Mio_DelayCompare( ppGates, ppGates + iGate - 1 ) <= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mio/mioUtils.c"
                        ,0x1d2,
                        "Mio_Gate_t **Mio_CollectRoots(Mio_Library_t *, int, float, int, int *, int)"
                       );
        }
      }
      if (pnGates != (int *)0x0) {
        *pnGates = uVar2;
      }
      return ppG1;
    }
    uVar4 = uVar2;
    if (((pGate_00->nInputs <= nInputs) &&
        ((((iVar6 == 0 || (iVar7 = Mio_GateReadProfile(pGate_00), iVar7 != 0)) ||
          (pGate_00->nInputs < 2)) && ((tDelay <= 0.0 || (pGate_00->dDelayMax <= (double)tDelay)))))
        ) && ((wVar1 = (pGate_00->field_15).uTruth, 1 < wVar1 + 1 &&
              (((wVar1 != 0xaaaaaaaaaaaaaaaa && (fSkipInv == 0 || wVar1 != 0x5555555555555555)) &&
               (pGate_00->pTwin == (Mio_Gate_t *)0x0)))))) {
      uVar8 = 0;
      if (0 < (int)uVar2) {
        uVar8 = (ulong)uVar2;
      }
      uVar3 = 0;
      do {
        uVar9 = uVar3;
        if (uVar8 == uVar9) {
          if (iVar5 <= (int)uVar2) {
            __assert_fail("iGate < nGates",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mio/mioUtils.c"
                          ,0x1c7,
                          "Mio_Gate_t **Mio_CollectRoots(Mio_Library_t *, int, float, int, int *, int)"
                         );
          }
          ppG1[(int)uVar2] = pGate_00;
          uVar4 = uVar2 + 1;
          if (fVerbose != 0) {
            printf("Selected gate %3d:   %-20s  A = %7.2f  D = %7.2f  %3s = %-s\n",pGate_00->dArea,
                   pGate_00->dDelayMax,(ulong)(uVar2 + 2),pGate_00->pName,pGate_00->pOutName,
                   pGate_00->pForm);
          }
          goto LAB_00317fc4;
        }
        pGate = ppG1[uVar9];
        uVar3 = uVar9 + 1;
      } while ((pGate->field_15).uTruth != wVar1);
      if (pGate->dArea <= (double)((float)pGate_00->dArea + 0.0094636)) {
        if ((double)((float)pGate_00->dArea + -0.0094636) <= pGate->dArea) {
          fVar10 = Mio_GateDelayAve(pGate);
          fVar11 = Mio_GateDelayAve(pGate_00);
          if (fVar11 + 0.0094636 < fVar10) goto LAB_00317f4e;
          if (fVar11 + -0.0094636 <= fVar10) {
            iVar7 = strcmp(pGate->pName,pGate_00->pName);
            if (0 < iVar7) goto LAB_00317f4e;
            if (-1 < iVar7) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mio/mioUtils.c"
                            ,0x19c,"int Mio_CompareTwoGates(Mio_Gate_t *, Mio_Gate_t *)");
            }
          }
        }
      }
      else {
LAB_00317f4e:
        ppG1[uVar9] = pGate_00;
      }
    }
LAB_00317fc4:
    uVar2 = uVar4;
    pGate_00 = Mio_GateReadNext(pGate_00);
  } while( true );
}

Assistant:

Mio_Gate_t ** Mio_CollectRoots( Mio_Library_t * pLib, int nInputs, float tDelay, int fSkipInv, int * pnGates, int fVerbose )
{
    Mio_Gate_t * pGate;
    Mio_Gate_t ** ppGates;
    int i, nGates, iGate, fProfile;
    nGates = Mio_LibraryReadGateNum( pLib );
    ppGates = ABC_ALLOC( Mio_Gate_t *, nGates );
    iGate = 0;
    // check if profile is entered
    fProfile = Mio_LibraryHasProfile( pLib );
    if ( fProfile )
        printf( "Mio_CollectRoots(): Using gate profile to select gates for mapping.\n" );
    // for each functionality, select gate with the smallest area
    // if equal areas, select gate with lexicographically smaller name
    Mio_LibraryForEachGate( pLib, pGate )
    {
        if ( pGate->nInputs > nInputs )
            continue;
        if ( fProfile && Mio_GateReadProfile(pGate) == 0 && pGate->nInputs > 1 )
            continue;
        if ( tDelay > 0.0 && pGate->dDelayMax > (double)tDelay )
            continue;
        if ( pGate->uTruth == 0 || pGate->uTruth == ~(word)0 )
            continue;
        if ( pGate->uTruth == ABC_CONST(0xAAAAAAAAAAAAAAAA) )
            continue;
        if ( pGate->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA) && fSkipInv )
            continue;
        if ( pGate->pTwin ) // skip multi-output gates for now
            continue;
        // check if the gate with this functionality already exists
        for ( i = 0; i < iGate; i++ )
            if ( ppGates[i]->uTruth == pGate->uTruth )
            {
                if ( Mio_CompareTwoGates(ppGates[i], pGate) )
                    ppGates[i] = pGate;
                break;
            }
        if ( i < iGate )
            continue;
        assert( iGate < nGates );
        ppGates[ iGate++ ] = pGate;
        if ( fVerbose )
            printf( "Selected gate %3d:   %-20s  A = %7.2f  D = %7.2f  %3s = %-s\n", 
                iGate+1, pGate->pName, pGate->dArea, pGate->dDelayMax, pGate->pOutName, pGate->pForm );
    }
    // sort by delay
    if ( iGate > 0 ) 
    {
        qsort( (void *)ppGates, iGate, sizeof(Mio_Gate_t *), 
                (int (*)(const void *, const void *)) Mio_DelayCompare );
        assert( Mio_DelayCompare( ppGates, ppGates + iGate - 1 ) <= 0 );
    }
    if ( pnGates )
        *pnGates = iGate;
    return ppGates;
}